

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3SnippetFindPositions(Fts3Expr *pExpr,int iPhrase,void *ctx)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  int local_2c;
  char *local_28;
  
  lVar4 = *(long *)((long)ctx + 0x18);
  *(int *)(lVar4 + (long)iPhrase * 0x30) = pExpr->pPhrase->nToken;
  iVar1 = sqlite3Fts3EvalPhrasePoslist(*ctx,pExpr,*(int *)((long)ctx + 8),&local_28);
  if (local_28 != (char *)0x0) {
    lVar4 = lVar4 + (long)iPhrase * 0x30;
    *(char **)(lVar4 + 8) = local_28;
    if (*local_28 < '\0') {
      uVar2 = sqlite3Fts3GetVarint32(local_28,&local_2c);
      uVar3 = (ulong)uVar2;
    }
    else {
      uVar3 = 1;
      local_2c = (int)*local_28;
    }
    *(char **)(lVar4 + 0x18) = local_28 + uVar3;
    *(char **)(lVar4 + 0x28) = local_28 + uVar3;
    *(int *)(lVar4 + 0x10) = local_2c + -2;
    *(int *)(lVar4 + 0x20) = local_2c + -2;
  }
  return iVar1;
}

Assistant:

static int fts3SnippetFindPositions(Fts3Expr *pExpr, int iPhrase, void *ctx){
  SnippetIter *p = (SnippetIter *)ctx;
  SnippetPhrase *pPhrase = &p->aPhrase[iPhrase];
  char *pCsr;
  int rc;

  pPhrase->nToken = pExpr->pPhrase->nToken;
  rc = sqlite3Fts3EvalPhrasePoslist(p->pCsr, pExpr, p->iCol, &pCsr);
  assert( rc==SQLITE_OK || pCsr==0 );
  if( pCsr ){
    int iFirst = 0;
    pPhrase->pList = pCsr;
    fts3GetDeltaPosition(&pCsr, &iFirst);
    assert( iFirst>=0 );
    pPhrase->pHead = pCsr;
    pPhrase->pTail = pCsr;
    pPhrase->iHead = iFirst;
    pPhrase->iTail = iFirst;
  }else{
    assert( rc!=SQLITE_OK || (
       pPhrase->pList==0 && pPhrase->pHead==0 && pPhrase->pTail==0 
    ));
  }

  return rc;
}